

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_create(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  ulong uVar2;
  undefined4 in_register_0000000c;
  int64_t iVar3;
  ulong uVar4;
  JSValue JVar5;
  JSValue JVar6;
  JSValue properties;
  
  iVar3 = argv->tag;
  if (((int)iVar3 != -1) && ((int)iVar3 != 2)) {
    uVar4 = 0;
    JS_ThrowTypeError(ctx,"not a prototype",iVar3,CONCAT44(in_register_0000000c,argc));
    iVar3 = 6;
    uVar2 = 0;
    goto LAB_00151351;
  }
  JVar5.tag = iVar3;
  JVar5.u.ptr = (argv->u).ptr;
  JVar5 = JS_NewObjectProto(ctx,JVar5);
  iVar3 = JVar5.tag;
  if ((int)JVar5.tag == 6) {
LAB_00151319:
    uVar4 = 0;
    uVar2 = 0;
    iVar3 = 6;
  }
  else {
    if ((int)argv[1].tag != 3) {
      properties.tag = argv[1].tag;
      properties.u.ptr = argv[1].u.ptr;
      iVar1 = JS_ObjectDefineProperties(ctx,JVar5,properties);
      if (iVar1 != 0) {
        JS_FreeValue(ctx,JVar5);
        goto LAB_00151319;
      }
    }
    uVar2 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
    uVar4 = (ulong)JVar5.u.ptr & 0xffffffff;
  }
LAB_00151351:
  JVar6.tag = iVar3;
  JVar6.u.ptr = (void *)(uVar4 | uVar2);
  return JVar6;
}

Assistant:

static JSValue js_object_create(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValueConst proto, props;
    JSValue obj;

    proto = argv[0];
    if (!JS_IsObject(proto) && !JS_IsNull(proto))
        return JS_ThrowTypeError(ctx, "not a prototype");
    obj = JS_NewObjectProto(ctx, proto);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    props = argv[1];
    if (!JS_IsUndefined(props)) {
        if (JS_ObjectDefineProperties(ctx, obj, props)) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}